

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall
QGraphicsScenePrivate::drawItems
          (QGraphicsScenePrivate *this,QPainter *painter,QTransform *viewTransform,
          QRegion *exposedRegion,QWidget *widget)

{
  long lVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  QRectF local_c8;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 *local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->unpolishedItems).d.size != 0) {
    _q_polishItems(this);
  }
  this->field_0xb8 = this->field_0xb8 & 0xfb;
  local_98 = 0.0;
  dStack_90 = 0.0;
  local_a8 = 0.0;
  dStack_a0 = 0.0;
  if ((exposedRegion != (QRegion *)0x0) && (this->indexMethod != NoIndex)) {
    auVar7 = QRegion::boundingRect();
    iVar5 = auVar7._4_4_ + -1;
    iVar4 = auVar7._0_4_ + -1;
    local_a8 = (double)iVar4;
    dStack_a0 = (double)iVar5;
    local_98 = (double)(((long)(auVar7._8_4_ + 1) - (long)iVar4) + 1);
    dStack_90 = (double)(((auVar7._8_8_ + 0x100000000 >> 0x20) - (long)iVar5) + 1);
    if (viewTransform != (QTransform *)0x0) {
      QTransform::inverted((bool *)&local_88);
      QTransform::mapRect(&local_c8);
      local_98 = local_c8.w;
      dStack_90 = local_c8.h;
      local_a8 = local_c8.xp;
      dStack_a0 = local_c8.yp;
    }
  }
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = 0xaaaaaaaa;
  uStack_84 = 0xaaaaaaaa;
  uStack_80 = 0xaaaaaaaa;
  uStack_7c = 0xaaaaaaaa;
  (**(code **)(*(long *)this->index + 0x98))(&local_88,this->index,&local_a8,0);
  if (local_78 != (undefined1 *)0x0) {
    lVar3 = CONCAT44(uStack_7c,uStack_80);
    lVar1 = (long)local_78 << 3;
    lVar6 = 0;
    do {
      drawSubtreeRecursive
                (this,*(QGraphicsItem **)(lVar3 + lVar6),painter,viewTransform,exposedRegion,widget,
                 1.0,(QTransform *)0x0);
      lVar6 = lVar6 + 8;
    } while (lVar1 != lVar6);
  }
  piVar2 = (int *)CONCAT44(uStack_84,local_88);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_84,local_88),8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::drawItems(QPainter *painter, const QTransform *const viewTransform,
                                      QRegion *exposedRegion, QWidget *widget)
{
    // Make sure we don't have unpolished items before we draw.
    if (!unpolishedItems.isEmpty())
        _q_polishItems();

    updateAll = false;
    QRectF exposedSceneRect;
    if (exposedRegion && indexMethod != QGraphicsScene::NoIndex) {
        exposedSceneRect = exposedRegion->boundingRect().adjusted(-1, -1, 1, 1);
        if (viewTransform)
            exposedSceneRect = viewTransform->inverted().mapRect(exposedSceneRect);
    }
    const QList<QGraphicsItem *> tli = index->estimateTopLevelItems(exposedSceneRect, Qt::AscendingOrder);
    for (const auto subTree : tli)
        drawSubtreeRecursive(subTree, painter, viewTransform, exposedRegion, widget);
}